

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

unsigned_long cmsys::SystemTools::FileLength(string *filename)

{
  int iVar1;
  stat fs;
  stat64 local_90;
  
  iVar1 = stat64((filename->_M_dataplus)._M_p,&local_90);
  if (iVar1 != 0) {
    local_90.st_size = 0;
  }
  return local_90.st_size;
}

Assistant:

unsigned long SystemTools::FileLength(const std::string& filename)
{
  unsigned long length = 0;
#ifdef _WIN32
  WIN32_FILE_ATTRIBUTE_DATA fs;
  if (GetFileAttributesExW(
        SystemTools::ConvertToWindowsExtendedPath(filename).c_str(),
        GetFileExInfoStandard, &fs) != 0)
    {
    /* To support the full 64-bit file size, use fs.nFileSizeHigh
     * and fs.nFileSizeLow to construct the 64 bit size

    length = ((__int64)fs.nFileSizeHigh << 32) + fs.nFileSizeLow;
     */
    length = static_cast<unsigned long>(fs.nFileSizeLow);
    }
#else
  struct stat fs;
  if (stat(filename.c_str(), &fs) == 0)
    {
    length = static_cast<unsigned long>(fs.st_size);
    }
#endif
  return length;
}